

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::SharedDtor(KNearestNeighborsClassifier *this)

{
  bool bVar1;
  KNearestNeighborsClassifier *pKVar2;
  KNearestNeighborsClassifier *this_local;
  
  pKVar2 = internal_default_instance();
  if ((this != pKVar2) && (this->nearestneighborsindex_ != (NearestNeighborsIndex *)0x0)) {
    (*(this->nearestneighborsindex_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pKVar2 = internal_default_instance();
  if ((this != pKVar2) && (this->numberofneighbors_ != (Int64Parameter *)0x0)) {
    (*(this->numberofneighbors_->super_MessageLite)._vptr_MessageLite[1])();
  }
  bVar1 = has_ClassLabels(this);
  if (bVar1) {
    clear_ClassLabels(this);
  }
  bVar1 = has_DefaultClassLabel(this);
  if (bVar1) {
    clear_DefaultClassLabel(this);
  }
  bVar1 = has_WeightingScheme(this);
  if (bVar1) {
    clear_WeightingScheme(this);
  }
  return;
}

Assistant:

void KNearestNeighborsClassifier::SharedDtor() {
  if (this != internal_default_instance()) {
    delete nearestneighborsindex_;
  }
  if (this != internal_default_instance()) {
    delete numberofneighbors_;
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
  if (has_DefaultClassLabel()) {
    clear_DefaultClassLabel();
  }
  if (has_WeightingScheme()) {
    clear_WeightingScheme();
  }
}